

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void check_permission(char *filename,uint mode)

{
  int iVar1;
  __uid_t _Var2;
  undefined8 uVar3;
  uv_loop_t *puVar4;
  void *pvVar5;
  undefined8 *puVar6;
  char *pcVar7;
  uv_loop_t *puVar8;
  char *pcVar9;
  undefined8 *puVar10;
  uv_loop_t *puVar11;
  char *pcVar12;
  char *unaff_R14;
  char *pcVar13;
  char *pcVar14;
  uv_buf_t uVar15;
  uv_fs_t req;
  undefined1 auStack_938 [88];
  long lStack_8e0;
  long lStack_8d8;
  code *pcStack_780;
  code *pcStack_778;
  undefined8 uStack_770;
  char acStack_760 [88];
  char *pcStack_708;
  uv_loop_t *puStack_5a8;
  code *pcStack_5a0;
  code *pcStack_598;
  code *pcStack_590;
  uv_loop_t *puStack_588;
  code *pcStack_580;
  char acStack_578 [88];
  uv_loop_t *puStack_520;
  char *pcStack_3c0;
  code *pcStack_3b8;
  undefined8 uStack_3b0;
  char acStack_3a0 [88];
  char *pcStack_348;
  undefined8 *puStack_1e8;
  undefined1 local_1c0 [88];
  long local_168;
  uint local_148;
  
  puVar6 = (undefined8 *)(ulong)mode;
  puVar10 = (undefined8 *)0x0;
  iVar1 = uv_fs_stat(0,local_1c0,filename,0);
  if (iVar1 == 0) {
    if (local_168 != 0) goto LAB_0015527c;
    if ((local_148 & 0x1ff) == mode) {
      uv_fs_req_cleanup(local_1c0);
      return;
    }
  }
  else {
    check_permission_cold_1();
LAB_0015527c:
    check_permission_cold_2();
  }
  check_permission_cold_3();
  if (*(int *)(puVar10 + 8) == 0xd) {
    puVar6 = puVar10;
    if (puVar10[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      uv_fs_req_cleanup(puVar10);
      check_permission("test_file",*(uint *)*puVar10);
      return;
    }
  }
  else {
    chmod_cb_cold_1();
  }
  chmod_cb_cold_2();
  if (*(int *)(puVar10 + 8) == 0xe) {
    puVar6 = puVar10;
    if (puVar10[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      uv_fs_req_cleanup(puVar10);
      check_permission("test_file",*(uint *)*puVar10);
      return;
    }
  }
  else {
    fchmod_cb_cold_1();
  }
  fchmod_cb_cold_2();
  pcVar7 = "test_file";
  pcStack_3b8 = (code *)0x155315;
  puStack_1e8 = puVar6;
  unlink("test_file");
  pcStack_3b8 = (code *)0x15531a;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_3b8 = (code *)0x15533e;
  iVar1 = uv_fs_open(0,acStack_3a0,"test_file",0x42,0x180,0);
  pcVar12 = pcStack_348;
  if (iVar1 < 0) {
    pcStack_3b8 = (code *)0x1554db;
    run_test_fs_unlink_readonly_cold_1();
LAB_001554db:
    pcStack_3b8 = (code *)0x1554e0;
    run_test_fs_unlink_readonly_cold_2();
LAB_001554e0:
    pcStack_3b8 = (code *)0x1554e5;
    run_test_fs_unlink_readonly_cold_3();
LAB_001554e5:
    pcStack_3b8 = (code *)0x1554ea;
    run_test_fs_unlink_readonly_cold_4();
LAB_001554ea:
    pcStack_3b8 = (code *)0x1554ef;
    run_test_fs_unlink_readonly_cold_5();
LAB_001554ef:
    pcStack_3b8 = (code *)0x1554f4;
    run_test_fs_unlink_readonly_cold_6();
LAB_001554f4:
    pcStack_3b8 = (code *)0x1554f9;
    run_test_fs_unlink_readonly_cold_7();
LAB_001554f9:
    pcStack_3b8 = (code *)0x1554fe;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    pcVar7 = pcStack_348;
    if ((long)pcStack_348 < 0) goto LAB_001554db;
    unaff_R14 = acStack_3a0;
    pcStack_3b8 = (code *)0x155361;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_3b8 = (code *)0x155372;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_3b0 = 0;
    pcStack_3b8 = (code *)0x1553a8;
    iVar1 = uv_fs_write(0,unaff_R14,(ulong)pcVar12 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar7 = pcVar12;
    if (iVar1 != 0xd) goto LAB_001554e0;
    if (pcStack_348 != (char *)0xd) goto LAB_001554e5;
    unaff_R14 = acStack_3a0;
    pcStack_3b8 = (code *)0x1553ca;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_3b8 = (code *)0x1553dd;
    uv_fs_close(loop,unaff_R14,(ulong)pcVar12 & 0xffffffff,0);
    pcStack_3b8 = (code *)0x1553f6;
    iVar1 = uv_fs_chmod(0,unaff_R14,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001554ea;
    if (pcStack_348 != (char *)0x0) goto LAB_001554ef;
    pcVar7 = acStack_3a0;
    pcStack_3b8 = (code *)0x155417;
    uv_fs_req_cleanup(pcVar7);
    unaff_R14 = "test_file";
    pcStack_3b8 = (code *)0x15542b;
    check_permission("test_file",0x100);
    pcStack_3b8 = (code *)0x15543a;
    iVar1 = uv_fs_unlink(0,pcVar7,"test_file",0);
    if (iVar1 != 0) goto LAB_001554f4;
    if (pcStack_348 != (char *)0x0) goto LAB_001554f9;
    pcStack_3b8 = (code *)0x15545b;
    uv_fs_req_cleanup(acStack_3a0);
    pcStack_3b8 = (code *)0x155469;
    uv_run(loop,0);
    unaff_R14 = "test_file";
    pcStack_3b8 = (code *)0x155485;
    uv_fs_chmod(0,acStack_3a0,"test_file",0x180,0);
    pcStack_3b8 = (code *)0x15548d;
    uv_fs_req_cleanup(acStack_3a0);
    pcStack_3b8 = (code *)0x155495;
    unlink("test_file");
    pcStack_3b8 = (code *)0x15549a;
    pcVar7 = (char *)uv_default_loop();
    pcStack_3b8 = (code *)0x1554ae;
    uv_walk(pcVar7,close_walk_cb,0);
    pcStack_3b8 = (code *)0x1554b8;
    uv_run(pcVar7,0);
    pcStack_3b8 = (code *)0x1554bd;
    uVar3 = uv_default_loop();
    pcStack_3b8 = (code *)0x1554c5;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_3b8 = run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  pcVar13 = acStack_578;
  pcVar14 = acStack_578;
  pcVar9 = acStack_578;
  pcVar12 = acStack_578;
  puVar8 = (uv_loop_t *)0x184395;
  pcStack_580 = (code *)0x15551c;
  pcStack_3c0 = pcVar7;
  pcStack_3b8 = (code *)unaff_R14;
  unlink("test_file");
  pcStack_580 = (code *)0x155528;
  unlink("test_file_link");
  pcStack_580 = (code *)0x15552d;
  loop = (uv_loop_t *)uv_default_loop();
  puVar4 = (uv_loop_t *)0x0;
  pcStack_580 = (code *)0x15554f;
  iVar1 = uv_fs_open(0,acStack_578,"test_file",0x42,0x180,0);
  puVar11 = puStack_520;
  if (iVar1 < 0) {
    pcStack_580 = (code *)0x155820;
    run_test_fs_chown_cold_1();
LAB_00155820:
    pcStack_580 = (code *)0x155825;
    run_test_fs_chown_cold_2();
LAB_00155825:
    pcStack_580 = (code *)0x15582a;
    run_test_fs_chown_cold_3();
LAB_0015582a:
    pcVar13 = unaff_R14;
    pcStack_580 = (code *)0x15582f;
    run_test_fs_chown_cold_4();
LAB_0015582f:
    pcStack_580 = (code *)0x155834;
    run_test_fs_chown_cold_5();
LAB_00155834:
    pcVar14 = pcVar13;
    pcStack_580 = (code *)0x155839;
    run_test_fs_chown_cold_6();
LAB_00155839:
    pcStack_580 = (code *)0x15583e;
    run_test_fs_chown_cold_7();
LAB_0015583e:
    pcStack_580 = (code *)0x155843;
    run_test_fs_chown_cold_8();
LAB_00155843:
    pcStack_580 = (code *)0x155848;
    run_test_fs_chown_cold_9();
LAB_00155848:
    pcStack_580 = (code *)0x15584d;
    run_test_fs_chown_cold_10();
LAB_0015584d:
    pcStack_580 = (code *)0x155852;
    run_test_fs_chown_cold_11();
LAB_00155852:
    pcStack_580 = (code *)0x155857;
    run_test_fs_chown_cold_12();
LAB_00155857:
    pcStack_580 = (code *)0x15585c;
    run_test_fs_chown_cold_13();
LAB_0015585c:
    pcVar9 = pcVar14;
    pcStack_580 = (code *)0x155861;
    run_test_fs_chown_cold_14();
LAB_00155861:
    pcStack_580 = (code *)0x155866;
    run_test_fs_chown_cold_15();
LAB_00155866:
    pcVar12 = pcVar9;
    pcStack_580 = (code *)0x15586b;
    run_test_fs_chown_cold_16();
LAB_0015586b:
    pcStack_580 = (code *)0x155870;
    run_test_fs_chown_cold_17();
LAB_00155870:
    pcStack_580 = (code *)0x155875;
    run_test_fs_chown_cold_18();
LAB_00155875:
    pcStack_580 = (code *)0x15587a;
    run_test_fs_chown_cold_19();
LAB_0015587a:
    pcStack_580 = (code *)0x15587f;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar8 = puStack_520;
    if ((long)puStack_520 < 0) goto LAB_00155820;
    pcStack_580 = (code *)0x155570;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_580 = (code *)0x15558f;
    iVar1 = uv_fs_chown(0,acStack_578,"test_file",0xffffffff,0xffffffff,0);
    puVar8 = puVar11;
    unaff_R14 = acStack_578;
    if (iVar1 != 0) goto LAB_00155825;
    unaff_R14 = acStack_578;
    if (puStack_520 != (uv_loop_t *)0x0) goto LAB_0015582a;
    pcStack_580 = (code *)0x1555ae;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_580 = (code *)0x1555c8;
    iVar1 = uv_fs_fchown(0,acStack_578,(ulong)puVar11 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015582f;
    pcVar13 = acStack_578;
    if (puStack_520 != (uv_loop_t *)0x0) goto LAB_00155834;
    pcStack_580 = (code *)0x1555e7;
    uv_fs_req_cleanup(acStack_578);
    pcStack_580 = (code *)0x15560f;
    puVar4 = loop;
    iVar1 = uv_fs_chown(loop,acStack_578,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar1 != 0) goto LAB_00155839;
    pcStack_580 = (code *)0x155625;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar14 = acStack_578;
    if (chown_cb_count != 1) goto LAB_0015583e;
    chown_cb_count = 0;
    pcStack_580 = (code *)0x15565e;
    puVar4 = loop;
    iVar1 = uv_fs_chown(loop,acStack_578,"test_file",0,0,chown_root_cb);
    pcVar14 = acStack_578;
    if (iVar1 != 0) goto LAB_00155843;
    pcStack_580 = (code *)0x155674;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar14 = acStack_578;
    if (chown_cb_count != 1) goto LAB_00155848;
    pcStack_580 = (code *)0x1556a4;
    puVar4 = loop;
    iVar1 = uv_fs_fchown(loop,acStack_578,(ulong)puVar11 & 0xffffffff,0xffffffff,0xffffffff,
                         fchown_cb);
    pcVar14 = acStack_578;
    if (iVar1 != 0) goto LAB_0015584d;
    pcStack_580 = (code *)0x1556ba;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar14 = acStack_578;
    if (fchown_cb_count != 1) goto LAB_00155852;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_580 = (code *)0x1556e2;
    iVar1 = uv_fs_link(0,acStack_578,"test_file","test_file_link",0);
    pcVar14 = acStack_578;
    if (iVar1 != 0) goto LAB_00155857;
    pcVar14 = acStack_578;
    if (puStack_520 != (uv_loop_t *)0x0) goto LAB_0015585c;
    pcStack_580 = (code *)0x155701;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_580 = (code *)0x155720;
    iVar1 = uv_fs_lchown(0,acStack_578,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_00155861;
    pcVar9 = acStack_578;
    if (puStack_520 != (uv_loop_t *)0x0) goto LAB_00155866;
    pcStack_580 = (code *)0x15573f;
    uv_fs_req_cleanup(acStack_578);
    pcStack_580 = (code *)0x155767;
    puVar4 = loop;
    iVar1 = uv_fs_lchown(loop,acStack_578,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar1 != 0) goto LAB_0015586b;
    pcStack_580 = (code *)0x15577d;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar12 = acStack_578;
    if (lchown_cb_count != 1) goto LAB_00155870;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_580 = (code *)0x155798;
    iVar1 = uv_fs_close(0,acStack_578,(ulong)puVar11 & 0xffffffff,0);
    pcVar12 = acStack_578;
    if (iVar1 != 0) goto LAB_00155875;
    pcVar12 = acStack_578;
    if (puStack_520 != (uv_loop_t *)0x0) goto LAB_0015587a;
    pcStack_580 = (code *)0x1557b4;
    uv_fs_req_cleanup(acStack_578);
    pcStack_580 = (code *)0x1557c2;
    uv_run(loop,0);
    pcStack_580 = (code *)0x1557ce;
    unlink("test_file");
    pcStack_580 = (code *)0x1557da;
    unlink("test_file_link");
    pcStack_580 = (code *)0x1557df;
    puVar8 = (uv_loop_t *)uv_default_loop();
    pcStack_580 = (code *)0x1557f3;
    uv_walk(puVar8,close_walk_cb,0);
    pcStack_580 = (code *)0x1557fd;
    uv_run(puVar8,0);
    pcStack_580 = (code *)0x155802;
    puVar4 = (uv_loop_t *)uv_default_loop();
    pcStack_580 = (code *)0x15580a;
    iVar1 = uv_loop_close();
    pcVar12 = acStack_578;
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_580 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar4->backend_fd == 0x1a) {
    if (puVar4->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    puStack_588 = (uv_loop_t *)0x1558a3;
    chown_cb_cold_1();
  }
  puStack_588 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_588 = puVar8;
  if (puVar4->backend_fd == 0x1a) {
    pcStack_590 = (code *)0x1558b7;
    puVar11 = puVar4;
    _Var2 = geteuid();
    pvVar5 = puVar4->watcher_queue[0];
    if (_Var2 != 0) {
      if (pvVar5 == (void *)0xffffffffffffffff) goto LAB_001558cf;
      pcStack_590 = (code *)0x1558ca;
      chown_root_cb_cold_2();
    }
    puVar8 = puVar4;
    if (pvVar5 == (void *)0x0) {
LAB_001558cf:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup(puVar4);
      return;
    }
  }
  else {
    pcStack_590 = (code *)0x1558e3;
    chown_root_cb_cold_1();
    puVar11 = puVar4;
  }
  pcStack_590 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar11->backend_fd == 0x1b) {
    if (puVar11->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_598 = (code *)0x155907;
    fchown_cb_cold_1();
  }
  pcStack_598 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar11->backend_fd == 0x1e) {
    if (puVar11->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_5a0 = (code *)0x15592b;
    lchown_cb_cold_1();
  }
  pcStack_5a0 = run_test_fs_link;
  lchown_cb_cold_2();
  pcVar9 = "test_file";
  pcStack_778 = (code *)0x155949;
  puStack_5a8 = puVar8;
  pcStack_5a0 = (code *)pcVar12;
  unlink("test_file");
  pcStack_778 = (code *)0x155955;
  unlink("test_file_link");
  pcStack_778 = (code *)0x155961;
  unlink("test_file_link2");
  pcStack_778 = (code *)0x155966;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar12 = (char *)0x0;
  pcStack_778 = (code *)0x15598a;
  iVar1 = uv_fs_open(0,acStack_760,"test_file",0x42,0x180,0);
  pcVar7 = pcStack_708;
  if (iVar1 < 0) {
    pcStack_778 = (code *)0x155cc8;
    run_test_fs_link_cold_1();
LAB_00155cc8:
    pcStack_778 = (code *)0x155ccd;
    run_test_fs_link_cold_2();
LAB_00155ccd:
    pcStack_778 = (code *)0x155cd2;
    run_test_fs_link_cold_3();
LAB_00155cd2:
    pcStack_778 = (code *)0x155cd7;
    run_test_fs_link_cold_4();
LAB_00155cd7:
    pcStack_778 = (code *)0x155cdc;
    run_test_fs_link_cold_5();
LAB_00155cdc:
    pcStack_778 = (code *)0x155ce1;
    run_test_fs_link_cold_6();
LAB_00155ce1:
    pcVar7 = pcVar9;
    pcStack_778 = (code *)0x155ce6;
    run_test_fs_link_cold_7();
LAB_00155ce6:
    pcStack_778 = (code *)0x155ceb;
    run_test_fs_link_cold_8();
LAB_00155ceb:
    pcStack_778 = (code *)0x155cf0;
    run_test_fs_link_cold_9();
LAB_00155cf0:
    pcStack_778 = (code *)0x155cf5;
    run_test_fs_link_cold_10();
LAB_00155cf5:
    pcStack_778 = (code *)0x155cfa;
    run_test_fs_link_cold_11();
LAB_00155cfa:
    pcStack_778 = (code *)0x155cff;
    run_test_fs_link_cold_12();
LAB_00155cff:
    pcStack_778 = (code *)0x155d04;
    run_test_fs_link_cold_13();
LAB_00155d04:
    pcVar9 = pcVar7;
    pcStack_778 = (code *)0x155d09;
    run_test_fs_link_cold_14();
LAB_00155d09:
    pcStack_778 = (code *)0x155d0e;
    run_test_fs_link_cold_15();
LAB_00155d0e:
    pcStack_778 = (code *)0x155d13;
    run_test_fs_link_cold_16();
LAB_00155d13:
    pcStack_778 = (code *)0x155d18;
    run_test_fs_link_cold_17();
LAB_00155d18:
    pcStack_778 = (code *)0x155d1d;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar9 = pcStack_708;
    if ((long)pcStack_708 < 0) goto LAB_00155cc8;
    pcStack_778 = (code *)0x1559ad;
    uv_fs_req_cleanup(acStack_760);
    pcStack_778 = (code *)0x1559be;
    uVar15 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_770 = 0;
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x1559f4;
    iov = uVar15;
    iVar1 = uv_fs_write(0,acStack_760,(ulong)pcVar7 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar9 = pcVar7;
    if (iVar1 != 0xd) goto LAB_00155ccd;
    if (pcStack_708 != (char *)0xd) goto LAB_00155cd2;
    pcStack_778 = (code *)0x155a16;
    uv_fs_req_cleanup(acStack_760);
    pcStack_778 = (code *)0x155a29;
    uv_fs_close(loop,acStack_760,(ulong)pcVar7 & 0xffffffff,0);
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155a44;
    iVar1 = uv_fs_link(0,acStack_760,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155cd7;
    if (pcStack_708 != (char *)0x0) goto LAB_00155cdc;
    pcStack_778 = (code *)0x155a65;
    uv_fs_req_cleanup();
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155a81;
    iVar1 = uv_fs_open(0,acStack_760,"test_file_link",2,0,0);
    pcVar7 = pcStack_708;
    pcVar9 = acStack_760;
    if (iVar1 < 0) goto LAB_00155ce1;
    if ((long)pcStack_708 < 0) goto LAB_00155ce6;
    pcStack_778 = (code *)0x155aa4;
    uv_fs_req_cleanup(acStack_760);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_778 = (code *)0x155ac6;
    uVar15 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_770 = 0;
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155af8;
    iov = uVar15;
    iVar1 = uv_fs_read(0,acStack_760,(ulong)pcVar7 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155ceb;
    if ((long)pcStack_708 < 0) goto LAB_00155cf0;
    pcVar12 = buf;
    pcStack_778 = (code *)0x155b1f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155cf5;
    pcStack_778 = (code *)0x155b2e;
    close((int)pcVar7);
    pcStack_778 = (code *)0x155b54;
    pcVar12 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_760,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155cfa;
    pcStack_778 = (code *)0x155b6a;
    pcVar12 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155cff;
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155b95;
    iVar1 = uv_fs_open(0,acStack_760,"test_file_link2",2,0,0);
    pcVar9 = pcStack_708;
    if (iVar1 < 0) goto LAB_00155d04;
    if ((long)pcStack_708 < 0) goto LAB_00155d09;
    pcStack_778 = (code *)0x155bb8;
    uv_fs_req_cleanup(acStack_760);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_778 = (code *)0x155bda;
    uVar15 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_770 = 0;
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155c0c;
    iov = uVar15;
    iVar1 = uv_fs_read(0,acStack_760,(ulong)pcVar9 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155d0e;
    if ((long)pcStack_708 < 0) goto LAB_00155d13;
    pcVar12 = buf;
    pcStack_778 = (code *)0x155c33;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155d18;
    pcStack_778 = (code *)0x155c50;
    uv_fs_close(loop,acStack_760,(ulong)pcVar9 & 0xffffffff,0);
    pcStack_778 = (code *)0x155c5e;
    uv_run(loop,0);
    pcStack_778 = (code *)0x155c6a;
    unlink("test_file");
    pcStack_778 = (code *)0x155c76;
    unlink("test_file_link");
    pcStack_778 = (code *)0x155c82;
    unlink("test_file_link2");
    pcStack_778 = (code *)0x155c87;
    pcVar9 = (char *)uv_default_loop();
    pcStack_778 = (code *)0x155c9b;
    uv_walk(pcVar9,close_walk_cb,0);
    pcStack_778 = (code *)0x155ca5;
    uv_run(pcVar9,0);
    pcStack_778 = (code *)0x155caa;
    pcVar12 = (char *)uv_default_loop();
    pcStack_778 = (code *)0x155cb2;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_778 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar12)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar12)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_780 = (code *)0x155d41;
    link_cb_cold_1();
  }
  pcStack_780 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_780 = (code *)pcVar9;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_938,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155e3b;
    if (dummy_cb_count != 1) goto LAB_00155e40;
    if (lStack_8d8 != 0) goto LAB_00155e45;
    if (lStack_8e0 != -2) goto LAB_00155e4a;
    uv_fs_req_cleanup(auStack_938);
    iVar1 = uv_fs_readlink(0,auStack_938,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155e4f;
    if (lStack_8d8 != 0) goto LAB_00155e54;
    if (lStack_8e0 == -2) {
      uv_fs_req_cleanup(auStack_938);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00155e5e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155e3b:
    run_test_fs_readlink_cold_2();
LAB_00155e40:
    run_test_fs_readlink_cold_3();
LAB_00155e45:
    run_test_fs_readlink_cold_4();
LAB_00155e4a:
    run_test_fs_readlink_cold_5();
LAB_00155e4f:
    run_test_fs_readlink_cold_6();
LAB_00155e54:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155e5e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void check_permission(const char* filename, unsigned int mode) {
  int r;
  uv_fs_t req;
  uv_stat_t* s;

  r = uv_fs_stat(NULL, &req, filename, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);

  s = &req.statbuf;
#if defined(_WIN32) || defined(__CYGWIN__) || defined(__MSYS__)
  /*
   * On Windows, chmod can only modify S_IWUSR (_S_IWRITE) bit,
   * so only testing for the specified flags.
   */
  ASSERT((s->st_mode & 0777) & mode);
#else
  ASSERT((s->st_mode & 0777) == mode);
#endif

  uv_fs_req_cleanup(&req);
}